

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O3

void __thiscall Liby::Buffer::retrieve(Buffer *this,off_t len)

{
  long lVar1;
  long lVar2;
  
  if (len < 0) {
    __assert_fail("len >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                  ,0xe8,"void Liby::Buffer::retrieve(off_t)");
  }
  lVar1 = this->leftIndex_;
  lVar2 = this->rightIndex_;
  if (lVar1 <= lVar2) {
    if (lVar2 != lVar1) {
      if (lVar2 - lVar1 < len) {
        this->leftIndex_ = 0;
        this->rightIndex_ = 0;
      }
      else {
        this->leftIndex_ = lVar1 + len;
      }
    }
    return;
  }
  __assert_fail("rightIndex_ >= leftIndex_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                ,0x5a,"off_t Liby::Buffer::size() const");
}

Assistant:

void Buffer::retrieve(off_t len) {
    assert(len >= 0);
    if (size() == 0) {
        return;
    } else if (len > size()) {
        leftIndex_ = rightIndex_ = 0;
    } else {
        leftIndex_ += len;
    }
    //    if (size() < capacity_ / 2) {
    //        Buffer b(*this);
    //        swap(b);
    //    }
}